

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ONX_Model::DimensionStyleWithFontCharacteristics
          (ONX_Model *this,ON_Font *font_characteristics,double model_space_text_scale)

{
  ON_ModelComponent *pOVar1;
  ON_DimStyle *pOVar2;
  uchar auVar3 [8];
  ON_Font *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ON_ModelComponentReference *this_00;
  ON_UUID OVar4;
  ON_ModelComponentReference OVar5;
  ON_ModelComponentReference existing_mcr;
  undefined1 local_40 [16];
  
  this_00 = (ON_ModelComponentReference *)&stack0xffffffffffffffd0;
  FirstDimensionStyleFromFont
            ((ONX_Model *)this_00,font_characteristics,model_space_text_scale,SUB81(in_RDX,0));
  pOVar1 = ON_ModelComponentReference::ModelComponent(this_00);
  pOVar2 = ON_DimStyle::Cast(&pOVar1->super_ON_Object);
  if (pOVar2 == (ON_DimStyle *)0x0) {
    OVar4 = ON_3dmSettings::CurrentDimensionStyleId
                      ((ON_3dmSettings *)&font_characteristics[3].m_point_size);
    auVar3 = OVar4._0_8_;
    OVar4.Data4[0] = auVar3[0];
    OVar4.Data4[1] = auVar3[1];
    OVar4.Data4[2] = auVar3[2];
    OVar4.Data4[3] = auVar3[3];
    OVar4.Data4[4] = auVar3[4];
    OVar4.Data4[5] = auVar3[5];
    OVar4.Data4[6] = auVar3[6];
    OVar4.Data4[7] = auVar3[7];
    OVar4._0_8_ = font_characteristics;
    DimensionStyleFromId((ONX_Model *)local_40,OVar4);
    pOVar1 = ON_ModelComponentReference::ModelComponent((ON_ModelComponentReference *)local_40);
    pOVar2 = ON_DimStyle::Cast(&pOVar1->super_ON_Object);
    ON_ModelComponentReference::~ON_ModelComponentReference((ON_ModelComponentReference *)local_40);
    pOVar2 = ON_DimStyle::CreateFromFont
                       (in_RDX,model_space_text_scale,pOVar2,
                        (ON_ComponentManifest *)&font_characteristics[0xb].m_outline_figure_type,
                        (ON_DimStyle *)0x0);
    if (pOVar2 != (ON_DimStyle *)0x0) {
      AddModelComponentForExperts
                (this,(ON_ModelComponent *)font_characteristics,SUB81(pOVar2,0),true,true);
      goto LAB_0046105a;
    }
    this_00 = &ON_ModelComponentReference::Empty;
  }
  ON_ModelComponentReference::ON_ModelComponentReference((ON_ModelComponentReference *)this,this_00)
  ;
LAB_0046105a:
  ON_ModelComponentReference::~ON_ModelComponentReference
            ((ON_ModelComponentReference *)&stack0xffffffffffffffd0);
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::DimensionStyleWithFontCharacteristics(
  const ON_Font& font_characteristics,
  double model_space_text_scale
)
{
  // search for existing dimension style
  const bool bIgnoreSystemComponents = true;
  ON_ModelComponentReference existing_mcr = this->FirstDimensionStyleFromFont(&font_characteristics, model_space_text_scale, bIgnoreSystemComponents);
  const ON_DimStyle* dim_style = ON_DimStyle::Cast(existing_mcr.ModelComponent());
  if (nullptr != dim_style)
    return existing_mcr;
  
  // create new dimension style
  const ON_DimStyle* default_dim_style = ON_DimStyle::Cast(this->DimensionStyleFromId(this->m_settings.CurrentDimensionStyleId()).ModelComponent());
  ON_DimStyle* new_dim_style = ON_DimStyle::CreateFromFont(&font_characteristics, model_space_text_scale, default_dim_style, &this->Manifest(), nullptr);
  if (nullptr != new_dim_style)
  {
    const bool bResolveIdAndNameConflicts = true;
    return this->AddManagedModelComponent(new_dim_style, bResolveIdAndNameConflicts);
  }

  return ON_ModelComponentReference::Empty;
}